

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

World * __thiscall
despot::PlannerBase::InitializeWorld
          (PlannerBase *this,string *world_type,DSPOMDP *model,Option *options)

{
  bool bVar1;
  World *pWVar2;
  ostream *poVar3;
  Option *options_local;
  DSPOMDP *model_local;
  string *world_type_local;
  PlannerBase *this_local;
  
  bVar1 = std::operator==(world_type,"pomdp");
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Unsupported world type (pomdp by default). To support custom world, implement "
                            );
    poVar3 = std::operator<<(poVar3,"InitializeWorld");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  pWVar2 = InitializePOMDPWorld(this,world_type,model,options);
  return pWVar2;
}

Assistant:

World* PlannerBase::InitializeWorld(std::string& world_type, DSPOMDP* model,
		option::Option* options) {
	if (world_type == "pomdp")
		return InitializePOMDPWorld(world_type, model, options);
	else {
		cerr
				<< "Unsupported world type (pomdp by default). To support custom world, implement "
				<< __FUNCTION__ << endl;
		exit(-1);
	}
}